

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

void __thiscall
TasGrid::GridGlobal::setSurplusRefinement
          (GridGlobal *this,double tolerance,int output,
          vector<int,_std::allocator<int>_> *level_limits)

{
  MultiIndexSet *mset;
  double dVar1;
  uint uVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  size_type __n;
  reference rVar6;
  vector<double,_std::allocator<double>_> surp;
  MultiIndexSet kids;
  vector<bool,_std::allocator<bool>_> flagged;
  
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
  computeSurpluses(&surp,this,output,true);
  uVar2 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&flagged,(long)(int)uVar2,(allocator_type *)&kids);
  mset = &(this->super_BaseCanonicalGrid).points;
  __n = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = __n;
  }
  for (; uVar5 != __n; __n = __n + 1) {
    dVar1 = surp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start[__n];
    rVar6 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&flagged,__n);
    puVar3 = rVar6._M_p;
    if (ABS(dVar1) <= tolerance) {
      uVar4 = ~rVar6._M_mask & *puVar3;
    }
    else {
      uVar4 = rVar6._M_mask | *puVar3;
    }
    *puVar3 = uVar4;
  }
  MultiIndexManipulations::selectFlaggedChildren
            (&kids,mset,(vector<bool,_std::allocator<bool>_> *)&flagged,
             (vector<int,_std::allocator<int>_> *)level_limits);
  if (kids.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      kids.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    MultiIndexSet::operator+=(&kids,mset);
    MultiIndexManipulations::completeSetToLower(&kids);
    MultiIndexSet::operator=(&this->updated_tensors,&kids);
    proposeUpdatedTensors(this);
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&kids.indexes.super__Vector_base<int,_std::allocator<int>_>);
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&flagged.super__Bvector_base<std::allocator<bool>_>);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&surp.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void GridGlobal::setSurplusRefinement(double tolerance, int output, const std::vector<int> &level_limits){
    clearRefinement();
    std::vector<double> surp = computeSurpluses(output, true);

    int n = points.getNumIndexes();
    std::vector<bool> flagged(n);

    for(int i=0; i<n; i++)
        flagged[i] = (std::abs(surp[i]) > tolerance);

    MultiIndexSet kids = MultiIndexManipulations::selectFlaggedChildren(points, flagged, level_limits);

    if (!kids.empty()){
        kids += points;
        MultiIndexManipulations::completeSetToLower(kids);

        updated_tensors = std::move(kids);
        proposeUpdatedTensors();
    }
}